

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_hierarchy.h
# Opt level: O3

void __thiscall
lf::refinement::MeshHierarchy::
MarkEdges<std::function<bool(lf::mesh::Mesh_const&,lf::mesh::Entity_const&)>const&>
          (MeshHierarchy *this,
          function<bool_(const_lf::mesh::Mesh_&,_const_lf::mesh::Entity_&)> *marker)

{
  pointer pvVar1;
  Mesh *pMVar2;
  _Bit_type *p_Var3;
  _Bit_type *p_Var4;
  Entity *pEVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  runtime_error *this_00;
  long extraout_RDX;
  ulong uVar10;
  _Bit_type _Var11;
  long lVar12;
  stringstream ss;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  pvVar1 = (this->edge_marked_).
           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pMVar2 = (this->meshes_).
           super__Vector_base<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = pvVar1[-1].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  uVar9 = pvVar1[-1].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  p_Var4 = pvVar1[-1].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  uVar7 = (*pMVar2->_vptr_Mesh[3])(pMVar2,1);
  if ((ulong)uVar9 + ((long)p_Var3 - (long)p_Var4) * 8 != (ulong)uVar7) {
LAB_0011c19a:
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Length  mismatch for edge flag array",0x24);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f8,"edge_marked_.back().size() == finest_mesh.NumEntities(1)","");
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.h"
               ,"");
    std::__cxx11::stringbuf::str();
    lf::base::AssertionFailed(&local_1f8,&local_218,0x1cc,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"this code should not be reached");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar8 = (*pMVar2->_vptr_Mesh[2])(pMVar2,1);
  if (extraout_RDX != 0) {
    lVar12 = 0;
    do {
      pEVar5 = *(Entity **)(CONCAT44(extraout_var,iVar8) + lVar12);
      uVar9 = (*pMVar2->_vptr_Mesh[5])(pMVar2,pEVar5);
      if ((marker->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
        goto LAB_0011c19a;
      }
      bVar6 = (*marker->_M_invoker)((_Any_data *)marker,pMVar2,pEVar5);
      p_Var3 = (this->edge_marked_).
               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
               super__Bit_iterator_base._M_p;
      uVar7 = uVar9 >> 6;
      uVar10 = 1L << ((byte)uVar9 & 0x3f);
      if (bVar6) {
        _Var11 = uVar10 | p_Var3[uVar7];
      }
      else {
        _Var11 = ~uVar10 & p_Var3[uVar7];
      }
      p_Var3[uVar7] = _Var11;
      lVar12 = lVar12 + 8;
    } while (extraout_RDX << 3 != lVar12);
  }
  return;
}

Assistant:

void MeshHierarchy::MarkEdges(Marker &&marker) {
  // Retrieve the finest mesh in the hierarchy
  const mesh::Mesh &finest_mesh(*meshes_.back());

  LF_VERIFY_MSG(edge_marked_.back().size() == finest_mesh.NumEntities(1),
                "Length  mismatch for edge flag array");

  // Run through the edges = entities of co-dimension 1
  for (const mesh::Entity *edge : finest_mesh.Entities(1)) {
    const glb_idx_t edge_index = finest_mesh.Index(*edge);
    (edge_marked_.back())[edge_index] = marker(finest_mesh, *edge);
  }
}